

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:537:11)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:537:11)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  Maybe<capnp::MessageReaderAndFds> local_3c8;
  ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> local_3a0;
  ExceptionOrValue local_1f0;
  char local_58;
  Maybe<capnp::MessageReaderAndFds> local_50;
  
  local_1f0.exception.ptr.isSet = false;
  local_58 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1f0);
  if (local_1f0.exception.ptr.isSet == true) {
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1f0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1f0.exception.ptr.field_1.value.ownFile.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1f0.exception.ptr.field_1.value.file;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1f0.exception.ptr.field_1._32_8_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1f0.exception.ptr.field_1.value.description.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1f0.exception.ptr.field_1.value.description.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1f0.exception.ptr.field_1.value.description.content.disposer;
    local_1f0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_1f0.exception.ptr.field_1.value.context.ptr.ptr;
    local_1f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1f0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3a0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1f0.exception.ptr.field_1 + 0x68),0x105);
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1f0.exception.ptr.field_1.value.details.builder.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1f0.exception.ptr.field_1.value.details.builder.pos;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1f0.exception.ptr.field_1.value.details.builder.endPtr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1f0.exception.ptr.field_1.value.details.builder.disposer;
    local_1f0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1f0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1f0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3a0.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> *)output,
               &local_3a0);
    uVar2 = local_3a0.value.ptr.field_1.value.ptr.ptr;
    if ((local_3a0.value.ptr.isSet == true) &&
       (local_3a0.value.ptr.field_1.value.ptr.ptr != (MessageReader *)0x0)) {
      local_3a0.value.ptr.field_1.value.ptr.ptr = (MessageReader *)0x0;
      (**(local_3a0.value.ptr.field_1.value.ptr.disposer)->_vptr_Disposer)
                (local_3a0.value.ptr.field_1.value.ptr.disposer,
                 (code *)((long)((MessageReader *)uVar2)->arenaSpace +
                         (long)(((MessageReader *)uVar2)->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  else {
    if (local_58 != '\x01') goto LAB_00308fd6;
    Maybe<capnp::MessageReaderAndFds>::Maybe(&local_3c8,&local_50);
    local_3a0.value.ptr.field_1.value.ptr.ptr = local_3c8.ptr.field_1.value.reader.ptr;
    if (local_3c8.ptr.isSet == true) {
      local_3c8.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      uVar2 = local_3c8.ptr.field_1.value.reader.disposer;
    }
    else {
      uVar2 = (Disposer *)0x0;
      local_3a0.value.ptr.field_1.value.ptr.ptr = (MessageReader *)0x0;
    }
    uVar1 = local_3c8.ptr.field_1.value.reader.ptr;
    if ((local_3c8.ptr.isSet != false) &&
       (local_3c8.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_3c8.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_3c8.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_3c8.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                         (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
    }
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3a0.value.ptr.isSet = true;
    local_3a0.value.ptr.field_1.value.ptr.disposer = (Disposer *)uVar2;
    ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> *)output,
               &local_3a0);
    uVar2 = local_3a0.value.ptr.field_1.value.ptr.ptr;
    if ((local_3a0.value.ptr.isSet == true) &&
       (local_3a0.value.ptr.field_1.value.ptr.ptr != (MessageReader *)0x0)) {
      local_3a0.value.ptr.field_1.value.ptr.ptr = (MessageReader *)0x0;
      (**(local_3a0.value.ptr.field_1.value.ptr.disposer)->_vptr_Disposer)
                (local_3a0.value.ptr.field_1.value.ptr.disposer,
                 (code *)((long)((MessageReader *)uVar2)->arenaSpace +
                         (long)(((MessageReader *)uVar2)->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  if (local_3a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00308fd6:
  uVar2 = local_50.ptr.field_1.value.reader.ptr;
  if (((local_58 == '\x01') && (local_50.ptr.isSet == true)) &&
     (local_50.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
    local_50.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
    (**(local_50.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
              (local_50.ptr.field_1.value.reader.disposer,
               (code *)((long)((MessageReader *)uVar2)->arenaSpace +
                       (long)(((MessageReader *)uVar2)->_vptr_MessageReader[-2] + -0x18)));
  }
  if (local_1f0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1f0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }